

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

void Abc_NtkStartReverseLevels(Abc_Ntk_t *pNtk,int nMaxLevelIncrease)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj_00;
  int local_2c;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  int nMaxLevelIncrease_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkLevel(pNtk);
  pNtk->LevelMax = iVar1 + nMaxLevelIncrease;
  pVVar2 = Vec_IntAlloc(0);
  pNtk->vLevelsR = pVVar2;
  pVVar2 = pNtk->vLevelsR;
  iVar1 = Abc_NtkObjNumMax(pNtk);
  Vec_IntFill(pVVar2,iVar1 + 1,0);
  p = Abc_NtkDfsReverse(pNtk);
  for (local_2c = 0; iVar1 = Vec_PtrSize(p), local_2c < iVar1; local_2c = local_2c + 1) {
    pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(p,local_2c);
    iVar1 = Abc_ObjReverseLevelNew(pObj_00);
    Abc_ObjSetReverseLevel(pObj_00,iVar1);
  }
  Vec_PtrFree(p);
  return;
}

Assistant:

void Abc_NtkStartReverseLevels( Abc_Ntk_t * pNtk, int nMaxLevelIncrease )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i;
    // remember the maximum number of direct levels
    pNtk->LevelMax = Abc_NtkLevel(pNtk) + nMaxLevelIncrease;
    // start the reverse levels
    pNtk->vLevelsR = Vec_IntAlloc( 0 );
    Vec_IntFill( pNtk->vLevelsR, 1 + Abc_NtkObjNumMax(pNtk), 0 );
    // compute levels in reverse topological order
    vNodes = Abc_NtkDfsReverse( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Abc_ObjSetReverseLevel( pObj, Abc_ObjReverseLevelNew(pObj) );
    Vec_PtrFree( vNodes );
}